

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase495::run(TestCase495 *this)

{
  long *plVar1;
  ConnectionReceiver *pCVar2;
  PromiseNode *pPVar3;
  int __fd;
  int iVar4;
  undefined8 *puVar5;
  Fault f;
  int originalDirFd;
  Own<kj::NetworkAddress> addr;
  Own<kj::ConnectionReceiver> listener;
  AsyncIoContext ioContext;
  undefined8 *local_98;
  long *plStack_90;
  Own<kj::ConnectionReceiver> local_88;
  int local_74;
  Promise<kj::Own<kj::NetworkAddress>_> local_70;
  undefined8 *local_60;
  long *local_58;
  undefined8 *local_50;
  long *local_48;
  undefined8 *local_40;
  long *local_38;
  Promise<kj::Own<kj::AsyncIoStream>_> local_20;
  
  setupAsyncIo();
  puVar5 = (undefined8 *)(**(code **)(*local_38 + 0x18))();
  (**(code **)*puVar5)(&local_98,puVar5,"unix-abstract:foo",0x12,0);
  Promise<kj::Own<kj::NetworkAddress>_>::wait(&local_70,&local_98);
  plVar1 = plStack_90;
  if (plStack_90 != (long *)0x0) {
    plStack_90 = (long *)0x0;
    (**(code **)*local_98)(local_98,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  (*(local_70.super_PromiseBase.node.ptr)->_vptr_PromiseNode[1])(&local_60);
  do {
    __fd = open(".",0x90000);
    local_74 = __fd;
    if (-1 < __fd) goto LAB_001f0c53;
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_88.disposer = (Disposer *)0x0;
    local_98 = (undefined8 *)0x0;
    plStack_90 = (long *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_88);
  }
LAB_001f0c53:
  do {
    iVar4 = chdir("/");
    if (-1 < iVar4) goto LAB_001f0c73;
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_88.disposer = (Disposer *)0x0;
    local_98 = (undefined8 *)0x0;
    plStack_90 = (long *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_88);
  }
LAB_001f0c73:
  (**(local_70.super_PromiseBase.node.ptr)->_vptr_PromiseNode)(&local_88);
  Promise<kj::Own<kj::AsyncIoStream>>::attach<kj::Own<kj::ConnectionReceiver>>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)&local_98,&local_88);
  Promise<kj::Own<kj::AsyncIoStream>_>::wait(&local_20,&local_98);
  pPVar3 = local_20.super_PromiseBase.node.ptr;
  if (local_20.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_20.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_20.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_20.super_PromiseBase.node.disposer,
               pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  plVar1 = plStack_90;
  if (plStack_90 != (long *)0x0) {
    plStack_90 = (long *)0x0;
    (**(code **)*local_98)(local_98,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  pCVar2 = local_88.ptr;
  if (local_88.ptr != (ConnectionReceiver *)0x0) {
    local_88.ptr = (ConnectionReceiver *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               pCVar2->_vptr_ConnectionReceiver[-2] + (long)&pCVar2->_vptr_ConnectionReceiver);
  }
  do {
    iVar4 = fchdir(__fd);
    if (-1 < iVar4) goto LAB_001f0d41;
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_88.disposer = (Disposer *)0x0;
    local_98 = (undefined8 *)0x0;
    plStack_90 = (long *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_88);
  }
LAB_001f0d41:
  close(__fd);
  plVar1 = local_58;
  if (local_58 != (long *)0x0) {
    local_58 = (long *)0x0;
    (**(code **)*local_60)(local_60,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  pPVar3 = local_70.super_PromiseBase.node.ptr;
  if (local_70.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_70.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_70.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_70.super_PromiseBase.node.disposer,
               pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  plVar1 = local_38;
  if (local_38 != (long *)0x0) {
    local_38 = (long *)0x0;
    (**(code **)*local_40)(local_40,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_48;
  if (local_48 != (long *)0x0) {
    local_48 = (long *)0x0;
    (**(code **)*local_50)(local_50,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, AbstractUnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<NetworkAddress> addr = network.parseAddress("unix-abstract:foo").wait(ioContext.waitScope);

  Own<ConnectionReceiver> listener = addr->listen();
  // chdir proves no filesystem dependence. Test fails for regular unix socket
  // but passes for abstract unix socket.
  int originalDirFd;
  KJ_SYSCALL(originalDirFd = open(".", O_RDONLY | O_DIRECTORY | O_CLOEXEC));
  KJ_DEFER(close(originalDirFd));
  KJ_SYSCALL(chdir("/"));
  KJ_DEFER(KJ_SYSCALL(fchdir(originalDirFd)));

  addr->connect().attach(kj::mv(listener)).wait(ioContext.waitScope);
}